

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_function.cpp
# Opt level: O1

void __thiscall
duckdb::Transformer::TransformWindowDef
          (Transformer *this,PGWindowDef *window_spec,WindowExpression *expr,char *window_name)

{
  pointer pOVar1;
  pointer pPVar2;
  ParserException *pPVar3;
  pointer pOVar4;
  string local_48;
  
  if (window_spec->partitionClause != (PGList *)0x0) {
    if ((window_name != (char *)0x0) &&
       ((expr->partitions).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (expr->partitions).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Cannot override PARTITION BY clause of window \"%s\"","");
      ParserException::ParserException<char_const*>(pPVar3,&local_48,window_name);
      __cxa_throw(pPVar3,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformExpressionList(this,window_spec->partitionClause,&expr->partitions);
  }
  if (window_spec->orderClause != (PGList *)0x0) {
    if ((window_name != (char *)0x0) &&
       ((expr->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (expr->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      pPVar3 = (ParserException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Cannot override ORDER BY clause of window \"%s\"","");
      ParserException::ParserException<char_const*>(pPVar3,&local_48,window_name);
      __cxa_throw(pPVar3,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformOrderBy(this,window_spec->orderClause,&expr->orders);
    pOVar1 = (expr->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar4 = (expr->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_start; pOVar4 != pOVar1; pOVar4 = pOVar4 + 1) {
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&pOVar4->expression);
      if ((pPVar2->super_BaseExpression).type == STAR) {
        pPVar3 = (ParserException *)__cxa_allocate_exception(0x10);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Cannot ORDER BY ALL in a window expression","");
        ParserException::ParserException(pPVar3,&local_48);
        __cxa_throw(pPVar3,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

void Transformer::TransformWindowDef(duckdb_libpgquery::PGWindowDef &window_spec, WindowExpression &expr,
                                     const char *window_name) {
	// next: partitioning/ordering expressions
	if (window_spec.partitionClause) {
		if (window_name && !expr.partitions.empty()) {
			throw ParserException("Cannot override PARTITION BY clause of window \"%s\"", window_name);
		}
		TransformExpressionList(*window_spec.partitionClause, expr.partitions);
	}
	if (window_spec.orderClause) {
		if (window_name && !expr.orders.empty()) {
			throw ParserException("Cannot override ORDER BY clause of window \"%s\"", window_name);
		}
		TransformOrderBy(window_spec.orderClause, expr.orders);
		for (auto &order : expr.orders) {
			if (order.expression->GetExpressionType() == ExpressionType::STAR) {
				throw ParserException("Cannot ORDER BY ALL in a window expression");
			}
		}
	}
}